

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CMoveStatement *statement)

{
  undefined8 uVar1;
  CExpression *pCVar2;
  CEseqExpression *this_00;
  long lVar3;
  CMoveStatement *pCVar4;
  CSeqStatement *pCVar5;
  CStatement *pCVar6;
  CExpression *pCVar7;
  CEseqExpression *sourceEseq;
  pointer_____offset_0x10___ *target;
  INode *pIVar8;
  undefined1 local_80 [16];
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_68;
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_60;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_58;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_50;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_48;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_38;
  
  pCVar2 = CMoveStatement::Target(statement);
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2,this);
  sourceEseq = (CEseqExpression *)
               (this->childExpression)._M_t.
               super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
               .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  pCVar2 = CMoveStatement::Source(statement);
  target = (pointer_____offset_0x10___ *)this;
  (**(pCVar2->super_IExpression).super_INode._vptr_INode)(pCVar2);
  pCVar2 = (this->childExpression)._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
  (this->childExpression)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)0x0;
  if (sourceEseq == (CEseqExpression *)0x0) {
    this_00 = (CEseqExpression *)0x0;
  }
  else {
    target = &CExpression::typeinfo;
    this_00 = (CEseqExpression *)
              __dynamic_cast(sourceEseq,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (pCVar2 == (CExpression *)0x0) {
    lVar3 = 0;
  }
  else {
    target = &CExpression::typeinfo;
    lVar3 = __dynamic_cast(pCVar2,&CExpression::typeinfo,&CEseqExpression::typeinfo,0);
  }
  if (this_00 == (CEseqExpression *)0x0 && lVar3 == 0) {
    pCVar4 = (CMoveStatement *)operator_new(0x18);
    local_40._M_head_impl = pCVar2;
    local_38._M_head_impl = (CExpression *)sourceEseq;
    CMoveStatement::CMoveStatement
              (pCVar4,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_38,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_40);
    pCVar6 = (this->childStatement)._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (this->childStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar4;
    if (pCVar6 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar6->super_IStatement).super_INode + 0x10))();
    }
    if (local_40._M_head_impl != (CExpression *)0x0) {
      (*((local_40._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_40._M_head_impl = (CExpression *)0x0;
    if ((CEseqExpression *)local_38._M_head_impl != (CEseqExpression *)0x0) {
      (*(((CExpression *)&(local_38._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_38._M_head_impl = (CExpression *)0x0;
    sourceEseq = (CEseqExpression *)0x0;
LAB_00138a1f:
    pCVar2 = (CExpression *)0x0;
  }
  else {
    if ((this_00 == (CEseqExpression *)0x0) && (lVar3 != 0)) {
      processSourceEseqInCMove((CEseqFloatVisitor *)local_80,(CExpression *)target,sourceEseq);
      uVar1 = local_80._0_8_;
      local_80._0_8_ = (INode *)0x0;
      pIVar8 = (INode *)(this->childStatement)._M_t.
                        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      (this->childStatement)._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)uVar1;
    }
    else {
      if ((this_00 != (CEseqExpression *)0x0) && (lVar3 == 0)) {
        pCVar5 = (CSeqStatement *)operator_new(0x18);
        pCVar6 = CEseqExpression::getStatement(this_00);
        (*(pCVar6->super_IStatement).super_INode._vptr_INode[3])(local_80,pCVar6);
        local_68._M_head_impl = (CExpressionList *)local_80._0_8_;
        local_80._0_8_ = (INode *)0x0;
        pCVar4 = (CMoveStatement *)operator_new(0x18);
        pCVar7 = CEseqExpression::getExpression(this_00);
        (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(local_80 + 8,pCVar7);
        local_50._M_head_impl = (CExpression *)local_80._8_8_;
        local_80._8_8_ =
             (__uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>)
             0x0;
        local_58._M_head_impl = pCVar2;
        CMoveStatement::CMoveStatement
                  (pCVar4,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                           *)&local_50,
                   (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    *)&local_58);
        local_48._M_head_impl = (CStatement *)pCVar4;
        CSeqStatement::CSeqStatement
                  (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                           *)&local_68,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_48);
        pCVar6 = (this->childStatement)._M_t.
                 super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                 .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
        (this->childStatement)._M_t.
        super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
        _M_t.
        super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
        .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar5;
        if (pCVar6 != (CStatement *)0x0) {
          (**(code **)((long)(pCVar6->super_IStatement).super_INode + 0x10))();
        }
        if ((CMoveStatement *)local_48._M_head_impl != (CMoveStatement *)0x0) {
          (*((INode *)&((local_48._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
            _vptr_INode[2])();
        }
        local_48._M_head_impl = (CStatement *)0x0;
        if (local_58._M_head_impl != (CExpression *)0x0) {
          (*((local_58._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
        }
        local_58._M_head_impl = (CExpression *)0x0;
        if (local_50._M_head_impl != (CExpression *)0x0) {
          (*(((IStatement *)&(local_50._M_head_impl)->super_IExpression)->super_INode)._vptr_INode
            [2])();
        }
        local_50._M_head_impl = (CExpression *)0x0;
        if ((CStatement *)local_80._8_8_ != (CStatement *)0x0) {
          (**(code **)((long)*(IStatement *)local_80._8_8_ + 0x10))();
        }
        if (local_68._M_head_impl != (CExpressionList *)0x0) {
          (*((INode *)&((local_68._M_head_impl)->super_IExpression).super_INode._vptr_INode)->
            _vptr_INode[2])();
        }
        local_68._M_head_impl = (CExpressionList *)0x0;
        if ((IStatement *)local_80._0_8_ != (IStatement *)0x0) {
          (**(code **)((long)*(INode *)local_80._0_8_ + 0x10))();
        }
        goto LAB_00138a1f;
      }
      if ((this_00 == (CEseqExpression *)0x0) || (lVar3 == 0)) goto LAB_00138a5f;
      pCVar5 = (CSeqStatement *)operator_new(0x18);
      pCVar7 = (CExpression *)CEseqExpression::getStatement(this_00);
      (*(((IStatement *)&pCVar7->super_IExpression)->super_INode)._vptr_INode[3])(local_80);
      local_70._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           local_80._0_8_;
      local_80._0_8_ = (INode *)0x0;
      processSourceEseqInCMove((CEseqFloatVisitor *)(local_80 + 8),pCVar7,sourceEseq);
      local_60._M_head_impl = (CExpressionList *)local_80._8_8_;
      local_80._8_8_ = (CStatement *)0x0;
      CSeqStatement::CSeqStatement
                (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                         *)&local_70,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_60);
      pCVar6 = (this->childStatement)._M_t.
               super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      (this->childStatement)._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)pCVar5;
      if (pCVar6 != (CStatement *)0x0) {
        (**(code **)((long)(pCVar6->super_IStatement).super_INode + 0x10))();
      }
      if (local_60._M_head_impl != (CExpressionList *)0x0) {
        (*(((IStatement *)&(local_60._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                  ();
      }
      local_60._M_head_impl = (CExpressionList *)0x0;
      if (local_70._M_t.
          super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
          .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
          0x0) {
        (**(code **)((long)*(INode *)local_70._M_t.
                                     super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                                     .super__Head_base<0UL,_const_IRT::CExpression_*,_false>.
                                     _M_head_impl + 0x10))();
      }
      local_70._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           )0x0;
      pIVar8 = (INode *)local_80._0_8_;
    }
    if (pIVar8 != (INode *)0x0) {
      (*((INode *)&((INode *)&pIVar8->_vptr_INode)->_vptr_INode)->_vptr_INode[2])();
    }
  }
LAB_00138a5f:
  if (pCVar2 != (CExpression *)0x0) {
    (*(pCVar2->super_IExpression).super_INode._vptr_INode[2])(pCVar2);
  }
  if (sourceEseq != (CEseqExpression *)0x0) {
    (*(sourceEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[2])(sourceEseq);
  }
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CMoveStatement &statement) {
    statement.Target()->Accept(*this);
    std::unique_ptr<const CExpression> target = std::move(childExpression);

    statement.Source()->Accept(*this);
    std::unique_ptr<const CExpression> source = std::move(childExpression);

    const CEseqExpression* targetEseq = dynamic_cast<const CEseqExpression*>(target.get());
    const CEseqExpression* sourceEseq = dynamic_cast<const CEseqExpression*>(source.get());

    if (targetEseq == nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CMoveStatement(
                std::move(target),
                std::move(source)
        ));

        return;
    }

    if (targetEseq == nullptr && sourceEseq != nullptr) {
        childStatement = std::move(processSourceEseqInCMove(target.get(), sourceEseq));

        return;
    }

    if (targetEseq != nullptr && sourceEseq == nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CMoveStatement(
                        std::move(targetEseq->getExpression()->Copy()),
                        std::move(source)
                ))
        ));

        return;
    }

    if (targetEseq != nullptr && sourceEseq != nullptr) {
        childStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(targetEseq->getStatement()->Copy()),
                std::move(processSourceEseqInCMove(target.get(), sourceEseq))
        ));

        return;
    }
}